

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationDataBuilder::addCE32
          (CollationDataBuilder *this,uint32_t ce32,UErrorCode *errorCode)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->ce32s).count;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      UVector32::addElement(&this->ce32s,ce32,errorCode);
      return uVar1;
    }
    if ((this->ce32s).elements[uVar2] == ce32) break;
    uVar2 = uVar2 + 1;
  }
  return (int32_t)uVar2;
}

Assistant:

int32_t
CollationDataBuilder::addCE32(uint32_t ce32, UErrorCode &errorCode) {
    int32_t length = ce32s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce32 == (uint32_t)ce32s.elementAti(i)) { return i; }
    }
    ce32s.addElement((int32_t)ce32, errorCode);  
    return length;
}